

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<int,_4> __thiscall tcu::chopToInt<4>(tcu *this,Vector<float,_4> *v)

{
  uint uVar1;
  ulong extraout_RDX;
  ulong uVar2;
  Vector<int,_4> VVar3;
  int local_1c;
  int i;
  Vector<float,_4> *v_local;
  Vector<int,_4> *res;
  
  Vector<int,_4>::Vector((Vector<int,_4> *)this);
  uVar2 = extraout_RDX;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    uVar1 = chopToInt(v->m_data[local_1c]);
    uVar2 = (ulong)uVar1;
    *(uint *)(this + (long)local_1c * 4) = uVar1;
  }
  VVar3.m_data[2] = (int)uVar2;
  VVar3.m_data[3] = (int)(uVar2 >> 0x20);
  VVar3.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar3.m_data;
}

Assistant:

Vector<int, Size> chopToInt (const Vector<float, Size>& v)
{
	Vector<int, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = chopToInt(v.m_data[i]);
	return res;
}